

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

void __thiscall
QCborContainerPrivate::replaceAt
          (QCborContainerPrivate *this,qsizetype idx,QCborValue *value,ContainerDisposition disp)

{
  Element e_00;
  bool bVar1;
  QFlagsStorage<QtCbor::Element::ValueFlag> QVar2;
  reference pEVar3;
  ByteData *pBVar4;
  undefined4 in_ECX;
  Element *in_RDX;
  QCborContainerPrivate *in_RSI;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  ByteData *b;
  Element *e;
  QCborContainerPrivate *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  QCborContainerPrivate *this_00;
  Int in_stack_fffffffffffffff0;
  long lVar5;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pEVar3 = QList<QtCbor::Element>::operator[]
                     ((QList<QtCbor::Element> *)in_stack_ffffffffffffffb0,(qsizetype)in_RDI);
  QVar2.i = (Int)QFlags<QtCbor::Element::ValueFlag>::operator&
                           ((QFlags<QtCbor::Element::ValueFlag> *)in_stack_ffffffffffffffb0,
                            (ValueFlag)((ulong)in_RDI >> 0x20));
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&stack0xfffffffffffffff4);
  if (bVar1) {
    deref(in_stack_ffffffffffffffb0);
    (pEVar3->field_0).value = 0;
    memset(&stack0xfffffffffffffff0,0,4);
    QFlags<QtCbor::Element::ValueFlag>::QFlags((QFlags<QtCbor::Element::ValueFlag> *)0x1ac2ff);
    (pEVar3->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = in_stack_fffffffffffffff0;
  }
  else {
    e_00.field_0.value._4_4_ = QVar2.i;
    e_00.field_0.value._0_4_ = in_stack_fffffffffffffff0;
    e_00.type = (int)lVar5;
    e_00.flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
         (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)(int)((ulong)lVar5 >> 0x20);
    pBVar4 = byteData(this_00,e_00);
    if (pBVar4 != (ByteData *)0x0) {
      in_RDI->usedData = in_RDI->usedData - (pBVar4->len + 8);
    }
  }
  replaceAt_internal(in_RSI,in_RDX,(QCborValue *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),
                     (ContainerDisposition)((ulong)pEVar3 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void replaceAt(qsizetype idx, const QCborValue &value, ContainerDisposition disp = CopyContainer)
    {
        QtCbor::Element &e = elements[idx];
        if (e.flags & QtCbor::Element::IsContainer) {
            e.container->deref();
            e.container = nullptr;
            e.flags = {};
        } else if (auto b = byteData(e)) {
            usedData -= b->len + sizeof(QtCbor::ByteData);
        }
        replaceAt_internal(e, value, disp);
    }